

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::findOrInsert<QByteArray>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this,QByteArray *key)

{
  size_t hash;
  ulong uVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Bucket local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (Bucket)ZEXT816(0);
  hash = qHash(key,this->seed);
  if (this->numBuckets == 0) {
    uVar1 = this->size;
LAB_0018b4a6:
    rehash(this,uVar1 + 1);
    local_38 = findBucketWithHash<QByteArray>(this,key,hash);
  }
  else {
    local_38 = findBucketWithHash<QByteArray>(this,key,hash);
    if ((local_38.span)->offsets[local_38.index] != 0xff) {
      uVar1 = ((long)local_38.span - (long)this->spans) / 0x90 << 7 | local_38.index;
      bVar2 = true;
      goto LAB_0018b4f2;
    }
    uVar1 = this->size;
    if (this->numBuckets >> 1 <= uVar1) goto LAB_0018b4a6;
  }
  Bucket::insert(&local_38);
  this->size = this->size + 1;
  uVar1 = ((long)local_38.span - (long)this->spans) / 0x90 << 7 | local_38.index;
  bVar2 = false;
LAB_0018b4f2:
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket = uVar1;
  __return_storage_ptr__->initialized = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }